

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

ssize_t mqtt_pack_subscribe_request(uint8_t *buf,size_t bufsz,uint packet_id,...)

{
  uint32_t uVar1;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  undefined8 in_RCX;
  long *plVar5;
  long *plVar6;
  uint16_t integer_htons;
  long *plVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *buf_00;
  uint8_t *puVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  mqtt_fixed_header fixed_header;
  va_list args;
  uint8_t max_qos [8];
  char *topic [8];
  mqtt_fixed_header local_154;
  uint local_148;
  undefined4 uStack_144;
  long *local_140;
  long *local_138;
  uint8_t auStack_130 [8];
  long alStack_128 [8];
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_138 = local_e8;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_148 = 0x18;
  uStack_144 = 0x30;
  plVar6 = (long *)&fixed_header.field_0x4;
  uVar2 = 0x18;
  lVar8 = 0;
  local_140 = plVar6;
  while( true ) {
    if (uVar2 < 0x29) {
      uVar10 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      plVar5 = (long *)((long)local_138 + uVar10);
      plVar7 = plVar6;
      local_148 = uVar2;
    }
    else {
      plVar7 = plVar6 + 1;
      plVar5 = plVar6;
      local_140 = plVar7;
    }
    lVar9 = *plVar5;
    alStack_128[lVar8] = lVar9;
    if (lVar9 == 0) break;
    if (uVar2 < 0x29) {
      uVar10 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      plVar6 = plVar7;
      plVar7 = (long *)((long)local_138 + uVar10);
      local_148 = uVar2;
    }
    else {
      plVar6 = plVar7 + 1;
      local_140 = plVar6;
    }
    auStack_130[lVar8] = (uint8_t)*plVar7;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      return -0x7ffffff5;
    }
  }
  local_154.control_type = MQTT_CONTROL_SUBSCRIBE;
  local_154._4_1_ = 2;
  local_154.remaining_length = 2;
  if (lVar8 == 0) {
    uVar10 = 2;
  }
  else {
    lVar9 = 0;
    do {
      uVar1 = local_154.remaining_length;
      sVar3 = strlen((char *)alStack_128[lVar9]);
      local_154.remaining_length = uVar1 + (int)sVar3 + 3;
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
    uVar10 = (ulong)local_154.remaining_length;
  }
  sVar4 = mqtt_pack_fixed_header(buf,bufsz,&local_154);
  if (sVar4 < 1) {
    return sVar4;
  }
  if (bufsz - sVar4 < uVar10) {
    return 0;
  }
  *(ushort *)(buf + sVar4) = (ushort)packet_id << 8 | (ushort)packet_id >> 8;
  buf_00 = buf + sVar4 + 2;
  if (lVar8 != 0) {
    lVar9 = 0;
    do {
      sVar4 = __mqtt_pack_str(buf_00,(char *)alStack_128[lVar9]);
      puVar11 = buf_00 + sVar4;
      buf_00 = puVar11 + 1;
      *puVar11 = auStack_130[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  return (long)buf_00 - (long)buf;
}

Assistant:

ssize_t mqtt_pack_subscribe_request(uint8_t *buf, size_t bufsz, unsigned int packet_id, ...) {
    va_list args;
    const uint8_t *const start = buf;
    ssize_t rv;
    struct mqtt_fixed_header fixed_header;
    unsigned int num_subs = 0;
    unsigned int i;
    const char *topic[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];
    uint8_t max_qos[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];

    /* parse all subscriptions */
    va_start(args, packet_id);
    for(;;) {
        topic[num_subs] = va_arg(args, const char*);
        if (topic[num_subs] == NULL) {
            /* end of list */
            break;
        }

        max_qos[num_subs] = (uint8_t) va_arg(args, unsigned int);

        ++num_subs;
        if (num_subs >= MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS) {
            va_end(args);
            return MQTT_ERROR_SUBSCRIBE_TOO_MANY_TOPICS;
        }
    }
    va_end(args);

    /* build the fixed header */
    fixed_header.control_type = MQTT_CONTROL_SUBSCRIBE;
    fixed_header.control_flags = 2u;
    fixed_header.remaining_length = 2u; /* size of variable header */
    for(i = 0; i < num_subs; ++i) {
        /* payload is topic name + max qos (1 byte) */
        fixed_header.remaining_length += __mqtt_packed_cstrlen(topic[i]) + 1;
    }

    /* pack the fixed header */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        return rv;
    }
    buf += rv;
    bufsz -= (unsigned long)rv;

    /* check that the buffer has enough space */
    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }
    
    
    /* pack variable header */
    buf += __mqtt_pack_uint16(buf, (uint16_t)packet_id);


    /* pack payload */
    for(i = 0; i < num_subs; ++i) {
        buf += __mqtt_pack_str(buf, topic[i]);
        *buf++ = max_qos[i];
    }

    return buf - start;
}